

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

TabularCPT * __thiscall
despot::Parser::CreateTabularStateTransition(Parser *this,TiXmlElement *e_CondProb)

{
  mapped_type pVVar1;
  pointer pSVar2;
  NamedVar *child;
  double dVar3;
  pointer pdVar4;
  bool bVar5;
  bool bVar6;
  bool condition;
  int iVar7;
  int iVar8;
  TiXmlElement *pTVar9;
  char *pcVar10;
  long *plVar11;
  TiXmlNode *pTVar12;
  mapped_type *ppVVar13;
  undefined7 extraout_var;
  pointer pSVar14;
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer ppCVar17;
  pointer pNVar18;
  ulong uVar19;
  Parser *this_00;
  long lVar20;
  long lVar21;
  uint uVar22;
  string parent_name;
  vector<double,_std::allocator<double>_> values;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [40];
  mapped_type local_298;
  Parser *local_290;
  vector<double,_std::allocator<double>_> local_288;
  pointer local_268;
  pointer local_260;
  pointer local_258;
  undefined1 local_250 [40];
  undefined1 local_228 [32];
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_208;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  pointer local_1b0;
  undefined1 local_1a8 [16];
  pointer ppCStack_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  string local_f8;
  vector<despot::NamedVar,_std::allocator<despot::NamedVar>_> *local_d8;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *local_d0;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *local_c8;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_c0;
  undefined1 local_a8 [32];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_2c0._32_8_ = e_CondProb;
  pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement(&e_CondProb->super_TiXmlNode,"Var");
  pcVar10 = util::tinyxml::TiXmlElement::GetText(pTVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,pcVar10,(allocator<char> *)local_2c0);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  local_d0 = &this->curr_state_vars_;
  bVar5 = Variable::IsVariableName(&local_88,local_d0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                 "In <StateTransitionFunction>: Var ",&local_68);
  plVar11 = (long *)std::__cxx11::string::append(local_2c0);
  psVar15 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_f8.field_2._M_allocated_capacity = *psVar15;
    local_f8.field_2._8_8_ = plVar11[3];
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar15;
    local_f8._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_f8._M_string_length = plVar11[1];
  *plVar11 = (long)psVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  pTVar12 = util::tinyxml::TiXmlNode::FirstChild((TiXmlNode *)local_2c0._32_8_,"Var");
  Ensure(this,bVar5,&local_f8,&pTVar12->super_TiXmlBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_268 = (pointer)&this->variables_;
  ppVVar13 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                           *)local_268,&local_68);
  child = (NamedVar *)*ppVVar13;
  local_208.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement((TiXmlNode *)local_2c0._32_8_,"Parent");
  pcVar10 = util::tinyxml::TiXmlElement::GetText(pTVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2c0,pcVar10,(allocator<char> *)local_2e0);
  local_2e0._0_8_ = (mapped_type)(local_2e0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0," ","");
  Tokenize(&local_110,(string *)local_2c0,(string *)local_2e0);
  if ((mapped_type)local_2e0._0_8_ != (mapped_type)(local_2e0 + 0x10)) {
    operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
  }
  local_290 = this;
  if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if (local_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_c8 = &local_290->prev_state_vars_;
    local_d8 = &local_290->action_vars_;
    lVar20 = 8;
    uVar19 = 0;
    do {
      local_2c0._0_8_ = local_2c0 + 0x10;
      lVar21 = *(long *)((long)local_110.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2c0,lVar21,
                 *(long *)((long)&((local_110.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar20) + lVar21);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_2c0._0_8_,(pointer)(local_2c0._0_8_ + local_2c0._8_8_));
      bVar5 = Variable::IsVariableName(&local_130,local_c8);
      condition = true;
      if (bVar5) {
LAB_00150295:
        local_298 = (mapped_type)((ulong)local_298 & 0xffffffff00000000);
      }
      else {
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,local_2c0._0_8_,(pointer)(local_2c0._0_8_ + local_2c0._8_8_)
                  );
        bVar6 = Variable::IsVariableName(&local_150,local_d0);
        if (bVar6) goto LAB_00150295;
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_2c0._0_8_,(pointer)(local_2c0._0_8_ + local_2c0._8_8_)
                  );
        condition = Variable::IsVariableName(&local_170,local_d8);
        local_298 = (mapped_type)CONCAT44(local_298._4_4_,(int)CONCAT71(extraout_var,1));
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                     "In <StateTransitionFunction>: Parent ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0)
      ;
      plVar11 = (long *)std::__cxx11::string::append((char *)local_2e0);
      local_1d0._0_8_ = &local_1c0;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar16) {
        local_1c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_1c0._8_8_ = plVar11[3];
      }
      else {
        local_1c0._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_1d0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar11;
      }
      local_1d0._8_8_ = plVar11[1];
      *plVar11 = (long)paVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      pTVar12 = util::tinyxml::TiXmlNode::FirstChild((TiXmlNode *)local_2c0._32_8_,"Parent");
      Ensure(local_290,condition,(string *)local_1d0,&pTVar12->super_TiXmlBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ != &local_1c0) {
        operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
      }
      if ((mapped_type)local_2e0._0_8_ != (mapped_type)(local_2e0 + 0x10)) {
        operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
      }
      if ((local_298._0_1_ != _S_red) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2)) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar5) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2)) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      ppVVar13 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                               *)local_268,(key_type *)local_2c0);
      local_2e0._0_8_ = *ppVVar13;
      std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
      emplace_back<despot::NamedVar*>
                ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&local_208,
                 (NamedVar **)local_2e0);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      uVar19 = uVar19 + 1;
      lVar20 = lVar20 + 0x20;
    } while (uVar19 < (ulong)((long)local_110.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_110.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pSVar14 = (pointer)operator_new(0x70);
  local_268 = pSVar14;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector(&local_c0,&local_208)
  ;
  TabularCPT::TabularCPT((TabularCPT *)pSVar14,child,&local_c0);
  if ((_Elt_pointer)
      local_c0.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar9 = GetParameterElement(local_290,(TiXmlElement *)local_2c0._32_8_);
  pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar9->super_TiXmlNode,"Entry");
  if (pTVar9 != (TiXmlElement *)0x0) {
    do {
      local_2c0._32_8_ = pTVar9;
      pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar9->super_TiXmlNode,"Instance");
      pcVar10 = util::tinyxml::TiXmlElement::GetText(pTVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2c0,pcVar10,(allocator<char> *)local_2e0);
      local_2e0._0_8_ = (mapped_type)(local_2e0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0," ","");
      Tokenize(&local_48,(string *)local_2c0,(string *)local_2e0);
      if ((mapped_type)local_2e0._0_8_ != (mapped_type)(local_2e0 + 0x10)) {
        operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
      }
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement
                         ((TiXmlNode *)local_2c0._32_8_,"ProbTable");
      pcVar10 = util::tinyxml::TiXmlElement::GetText(pTVar9);
      this_00 = (Parser *)local_2c0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2c0,pcVar10,(allocator<char> *)local_2e0);
      iVar7 = ComputeNumOfEntries(this_00,&local_48,&local_208,child);
      iVar8 = std::__cxx11::string::compare((char *)local_2c0);
      if (iVar8 == 0) {
        if (0 < iVar7) {
          local_298 = (mapped_type)
                      (1.0 / (double)(int)((ulong)((long)(child->super_Variable).values_.
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(child->super_Variable).values_.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
          do {
            local_2e0._0_8_ = local_298;
            if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (&local_288,
                         (iterator)
                         local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(double *)local_2e0);
            }
            else {
              *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = (double)local_298;
              local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)local_2c0);
        if (iVar8 == 0) {
          if (0 < (int)((ulong)((long)(child->super_Variable).values_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(child->super_Variable).values_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
            iVar7 = 0;
            do {
              if (0 < (int)((ulong)((long)(child->super_Variable).values_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(child->super_Variable).values_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
                iVar8 = 0;
                do {
                  uVar22 = 0x3ff00000;
                  if (iVar7 != iVar8) {
                    uVar22 = 0;
                  }
                  local_2e0._0_8_ = (ulong)uVar22 << 0x20;
                  if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              (&local_288,
                               (iterator)
                               local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,(double *)local_2e0);
                  }
                  else {
                    *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = (double)((ulong)uVar22 << 0x20);
                    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  iVar8 = iVar8 + 1;
                } while (iVar8 < (int)((ulong)((long)(child->super_Variable).values_.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(child->super_Variable).values_.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < (int)((ulong)((long)(child->super_Variable).values_.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(child->super_Variable).values_.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 5));
          }
        }
        else {
          local_2e0._0_8_ = local_2e0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0," ","");
          Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_250 + 0x10),(string *)local_2c0,(string *)local_2e0);
          if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
            operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
          }
          lVar20 = local_250._24_8_ - local_250._16_8_;
          to_string<int>((string *)local_a8,iVar7);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x177013);
          ppCVar17 = (pointer)(plVar11 + 2);
          if ((pointer)*plVar11 == ppCVar17) {
            local_1a8._8_8_ = *ppCVar17;
            ppCStack_198 = (pointer)plVar11[3];
            local_1b0 = (pointer)(local_1a8 + 8);
          }
          else {
            local_1a8._8_8_ = *ppCVar17;
            local_1b0 = (pointer)*plVar11;
          }
          local_1a8._0_8_ = plVar11[1];
          *plVar11 = (long)ppCVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          local_260 = (pointer)local_250;
          pSVar14 = (pointer)(plVar11 + 2);
          if ((pointer)*plVar11 == pSVar14) {
            local_250._0_8_ = (pSVar14->super_NamedVar).super_Variable._vptr_Variable;
            local_250._8_8_ = plVar11[3];
          }
          else {
            local_250._0_8_ = (pSVar14->super_NamedVar).super_Variable._vptr_Variable;
            local_260 = (pointer)*plVar11;
          }
          local_258 = (pointer)plVar11[1];
          *plVar11 = (long)pSVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          to_string<unsigned_long>
                    ((string *)local_228,(long)(local_250._24_8_ - local_250._16_8_) >> 5);
          pSVar14 = (pointer)0xf;
          if (local_260 != (pointer)local_250) {
            pSVar14 = (pointer)local_250._0_8_;
          }
          pSVar2 = (pointer)((long)&((Variable *)local_228._8_8_)->_vptr_Variable + (long)local_258)
          ;
          if (pSVar14 < pSVar2) {
            pSVar14 = (pointer)0xf;
            if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
              pSVar14 = (pointer)local_228._16_8_;
            }
            if (pSVar14 < pSVar2) goto LAB_00150931;
            plVar11 = (long *)std::__cxx11::string::replace
                                        ((ulong)local_228,0,(char *)0x0,(ulong)local_260);
          }
          else {
LAB_00150931:
            plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_260,local_228._0_8_);
          }
          local_2e0._0_8_ = local_2e0 + 0x10;
          pVVar1 = (mapped_type)(plVar11 + 2);
          if ((mapped_type)*plVar11 == pVVar1) {
            local_2e0._16_8_ = pVVar1->_vptr_Variable;
            local_2e0._24_8_ = plVar11[3];
          }
          else {
            local_2e0._16_8_ = pVVar1->_vptr_Variable;
            local_2e0._0_8_ = (mapped_type)*plVar11;
          }
          local_2e0._8_8_ = plVar11[1];
          *plVar11 = (long)pVVar1;
          plVar11[1] = 0;
          *(undefined1 *)&pVVar1->_vptr_Variable = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)local_2e0);
          local_1f0._0_8_ = &local_1e0;
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar16) {
            local_1e0._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_1e0._8_8_ = plVar11[3];
          }
          else {
            local_1e0._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_1f0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar11;
          }
          local_1f0._8_8_ = plVar11[1];
          *plVar11 = (long)paVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement
                             ((TiXmlNode *)local_2c0._32_8_,"ProbTable");
          Ensure(local_290,lVar20 >> 5 == (long)iVar7,(string *)local_1f0,(TiXmlBase *)pTVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._0_8_ != &local_1e0) {
            operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._0_8_ + 1));
          }
          if ((mapped_type)local_2e0._0_8_ != (mapped_type)(local_2e0 + 0x10)) {
            operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
          }
          if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
            operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
          }
          if (local_260 != (pointer)local_250) {
            operator_delete(local_260,
                            (ulong)((long)&(((NamedVar *)local_250._0_8_)->super_Variable).
                                           _vptr_Variable + 1));
          }
          if (local_1b0 != (pointer)(local_1a8 + 8)) {
            operator_delete(local_1b0,(ulong)(local_1a8._8_8_ + 1));
          }
          if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
            operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
          }
          std::vector<double,_std::allocator<double>_>::resize
                    (&local_288,(long)(local_250._24_8_ - local_250._16_8_) >> 5);
          pdVar4 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (local_250._24_8_ - local_250._16_8_ != 0) {
            lVar20 = (long)(local_250._24_8_ - local_250._16_8_) >> 5;
            lVar21 = 0;
            pNVar18 = (pointer)local_250._16_8_;
            do {
              dVar3 = atof((char *)(pNVar18->super_Variable)._vptr_Variable);
              *(double *)((_Rb_tree_color *)pdVar4 + lVar21 * 2) = dVar3;
              lVar21 = lVar21 + 1;
              pNVar18 = (pointer)&(pNVar18->super_Variable).index_;
            } while (lVar20 + (ulong)(lVar20 == 0) != lVar21);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_250 + 0x10));
          pSVar14 = local_268;
        }
      }
      iVar7 = (*((Function *)&(pSVar14->super_NamedVar).super_Variable)->_vptr_Function[2])
                        (pSVar14,&local_48,&local_288);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,"In <StateTransitionFunction>: Value assignment failed.","");
      pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement((TiXmlNode *)local_2c0._32_8_,"Instance")
      ;
      Ensure(local_290,SUB41(iVar7,0),&local_190,(TiXmlBase *)pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,
                        (ulong)(local_190.field_2._M_allocated_capacity + 1));
      }
      pTVar9 = util::tinyxml::TiXmlNode::NextSiblingElement((TiXmlNode *)local_2c0._32_8_);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      if ((_Base_ptr)
          local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
        operator_delete(local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    } while (pTVar9 != (TiXmlElement *)0x0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  if ((pointer)local_208.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return (TabularCPT *)pSVar14;
}

Assistant:

TabularCPT* Parser::CreateTabularStateTransition(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, curr_state_vars_),
		"In <StateTransitionFunction>: Var " + name
			+ " has not been declared as a StateVar vnameCurr within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	StateVar* child = static_cast<StateVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, prev_state_vars_)
				|| Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <StateTransitionFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnamePrev/vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	TabularCPT* func = new TabularCPT(child, parents);

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		int num_entries = ComputeNumOfEntries(instance, parents, child);

		if (table == "uniform") { // keyword uniform
			int num = child->Size();
			for (int i = 0; i < num_entries; i++) {
				values.push_back(1.0 / num);
			}
		} else if (table == "identity") { // keyword identity
			//EnsureIdentityIsValid(); // TODO
			for (int i = 0; i < child->Size(); i++) {
				for (int j = 0; j < child->Size(); j++) {
					values.push_back(i == j);
				}
			}
		} else { // numbers
			vector<string> value_tokens = Tokenize(table);

			Ensure(num_entries == value_tokens.size(),
				"In <StateTransitionFunction>: " + to_string(num_entries)
					+ " entries expected but " + to_string(value_tokens.size())
					+ " found.", GetFirstChildElement(e_Entry, "ProbTable"));

			values.resize(value_tokens.size());
			for (int i = 0; i < value_tokens.size(); i++) {
				values[i] = atof(value_tokens[i].c_str());
			}
		}

		bool success = func->SetValue(instance, values);

		Ensure(success,
			"In <StateTransitionFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}